

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

int __thiscall amrex::ParmParse::countval(ParmParse *this,char *name,int n)

{
  Table *table;
  PP_entry *pPVar1;
  int iVar2;
  allocator local_61;
  string local_60;
  string local_40;
  
  table = this->m_table;
  std::__cxx11::string::string((string *)&local_60,name,&local_61);
  prefixedName(&local_40,this,&local_60);
  iVar2 = 0;
  pPVar1 = anon_unknown_12::ppindex(table,n,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (pPVar1 != (PP_entry *)0x0) {
    iVar2 = (int)((ulong)((long)(pPVar1->m_vals).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pPVar1->m_vals).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
  }
  return iVar2;
}

Assistant:

int
ParmParse::countval (const char* name,
                     int         n) const
{
    //
    // First find n'th occurrence of name in table.
    //
    const PP_entry* def = ppindex(m_table, n, prefixedName(name), false);
    return def == 0 ? 0 : def->m_vals.size();
}